

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.c
# Opt level: O0

exr_result_t default_pack(exr_encode_pipeline_t *encode)

{
  short sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long in_RDI;
  int x_8;
  uint32_t *dst_8;
  float tmp_1;
  int x_7;
  uint32_t *dst_7;
  uint16_t tmp;
  int x_6;
  uint32_t *dst_6;
  uint32_t fint_1;
  int x_5;
  uint32_t *dst_5;
  int x_4;
  uint32_t *dst_4;
  uint32_t fint;
  int x_3;
  uint32_t *dst_3;
  uint16_t cval_1;
  int x_2;
  uint16_t *dst_2;
  uint16_t cval;
  int x_1;
  uint16_t *dst_1;
  int x;
  uint16_t *dst;
  exr_coding_channel_info_t *encc;
  int c;
  int cury;
  int y;
  uint64_t chan_bytes;
  uint64_t packed_bytes;
  int pixincrement;
  int bpc;
  int w;
  uint8_t *cdata;
  uint8_t *dstbuffer;
  void *in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  int local_e4;
  int local_d4;
  void *local_d0;
  int local_c4;
  void *local_c0;
  int local_b4;
  int local_a4;
  int local_94;
  int local_84;
  int local_74;
  int local_64;
  int local_4c;
  int local_44;
  long local_38;
  float *local_20;
  void *local_18;
  
  local_18 = *(void **)(in_RDI + 0x68);
  local_38 = 0;
  local_44 = 0;
  do {
    if (*(int *)(in_RDI + 0x2c) <= local_44) {
      *(long *)(in_RDI + 0x70) = local_38;
      return 0;
    }
    iVar2 = *(int *)(in_RDI + 0x28);
    for (local_4c = 0; local_4c < *(short *)(in_RDI + 0x10); local_4c = local_4c + 1) {
      lVar5 = *(long *)(in_RDI + 8) + (long)local_4c * 0x30;
      if (*(int *)(lVar5 + 8) != 0) {
        local_20 = *(float **)(lVar5 + 0x28);
        iVar3 = *(int *)(lVar5 + 0xc);
        lVar6 = (long)iVar3 * (long)(int)*(char *)(lVar5 + 0x19);
        if (*(int *)(lVar5 + 0x14) < 2) {
          local_20 = (float *)((long)local_44 * (long)*(int *)(lVar5 + 0x24) + (long)local_20);
        }
        else {
          if ((local_44 + iVar2) % *(int *)(lVar5 + 0x14) != 0) goto LAB_00b63c12;
          if (local_20 != (float *)0x0) {
            local_20 = (float *)((long)(local_44 / *(int *)(lVar5 + 0x14)) *
                                 (long)*(int *)(lVar5 + 0x24) + (long)local_20);
          }
        }
        iVar4 = *(int *)(lVar5 + 0x20);
        sVar1 = *(short *)(lVar5 + 0x1a);
        if (sVar1 == 0) {
          sVar1 = *(short *)(lVar5 + 0x1e);
          if (sVar1 == 0) {
            for (local_e4 = 0; local_e4 < iVar3; local_e4 = local_e4 + 1) {
              unaligned_store32(in_stack_ffffffffffffff00,
                                (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            }
          }
          else if (sVar1 == 1) {
            local_c0 = local_18;
            for (local_c4 = 0; local_c4 < iVar3; local_c4 = local_c4 + 1) {
              in_stack_ffffffffffffff00 = local_c0;
              half_to_uint(0xb6);
              unaligned_store32(in_stack_ffffffffffffff00,
                                (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
              local_c0 = (void *)((long)local_c0 + 4);
            }
          }
          else {
            if (sVar1 != 2) {
              return 3;
            }
            local_d0 = local_18;
            for (local_d4 = 0; local_d4 < iVar3; local_d4 = local_d4 + 1) {
              in_stack_fffffffffffffef8 = local_d0;
              float_to_uint(*local_20);
              unaligned_store32(in_stack_ffffffffffffff00,
                                (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
              local_d0 = (void *)((long)local_d0 + 4);
              local_20 = (float *)((long)local_20 + (long)iVar4);
            }
          }
        }
        else if (sVar1 == 1) {
          sVar1 = *(short *)(lVar5 + 0x1e);
          if (sVar1 == 0) {
            for (local_84 = 0; local_84 < iVar3; local_84 = local_84 + 1) {
              uint_to_half(0xb637c8);
              unaligned_store16(in_stack_ffffffffffffff00,
                                (uint16_t)((ulong)in_stack_fffffffffffffef8 >> 0x30));
            }
          }
          else if (sVar1 == 1) {
            for (local_64 = 0; local_64 < iVar3; local_64 = local_64 + 1) {
              unaligned_store16(in_stack_ffffffffffffff00,
                                (uint16_t)((ulong)in_stack_fffffffffffffef8 >> 0x30));
            }
          }
          else {
            if (sVar1 != 2) {
              return 3;
            }
            for (local_74 = 0; local_74 < iVar3; local_74 = local_74 + 1) {
              float_to_half(0.0);
              unaligned_store16(in_stack_ffffffffffffff00,
                                (uint16_t)((ulong)in_stack_fffffffffffffef8 >> 0x30));
            }
          }
        }
        else {
          if (sVar1 != 2) {
            return 3;
          }
          sVar1 = *(short *)(lVar5 + 0x1e);
          if (sVar1 == 0) {
            for (local_b4 = 0; local_b4 < iVar3; local_b4 = local_b4 + 1) {
              uint_to_float_int(0);
              unaligned_store32(in_stack_ffffffffffffff00,
                                (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            }
          }
          else if (sVar1 == 1) {
            for (local_94 = 0; local_94 < iVar3; local_94 = local_94 + 1) {
              half_to_float_int(0);
              unaligned_store32(in_stack_ffffffffffffff00,
                                (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            }
          }
          else {
            if (sVar1 != 2) {
              return 3;
            }
            for (local_a4 = 0; local_a4 < iVar3; local_a4 = local_a4 + 1) {
              unaligned_store32(in_stack_ffffffffffffff00,
                                (uint32_t)((ulong)in_stack_fffffffffffffef8 >> 0x20));
            }
          }
        }
        local_18 = (void *)(lVar6 + (long)local_18);
        local_38 = lVar6 + local_38;
      }
LAB_00b63c12:
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static exr_result_t
default_pack (exr_encode_pipeline_t* encode)
{
    uint8_t*       dstbuffer = encode->packed_buffer;
    const uint8_t* cdata;
    int            w, bpc, pixincrement;
    uint64_t       packed_bytes = 0;
    uint64_t       chan_bytes   = 0;

    for (int y = 0; y < encode->chunk.height; ++y)
    {
        int cury = y + encode->chunk.start_y;

        for (int c = 0; c < encode->channel_count; ++c)
        {
            exr_coding_channel_info_t* encc = (encode->channels + c);

            if (encc->height == 0) continue;

            cdata      = encc->encode_from_ptr;
            w          = encc->width;
            bpc        = encc->bytes_per_element;
            chan_bytes = (uint64_t) (w) * (uint64_t) (bpc);

            if (encc->y_samples > 1)
            {
                if ((cury % encc->y_samples) != 0) continue;
                if (cdata)
                    cdata +=
                        ((uint64_t) (y / encc->y_samples) *
                         (uint64_t) encc->user_line_stride);
            }
            else { cdata += (uint64_t) y * (uint64_t) encc->user_line_stride; }

            pixincrement = encc->user_pixel_stride;
            switch (encc->data_type)
            {
                case EXR_PIXEL_HALF:
                    switch (encc->user_data_type)
                    {
                        case EXR_PIXEL_HALF: {
                            uint16_t* dst = (uint16_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                unaligned_store16 (
                                    dst, *((const uint16_t*) cdata));
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        case EXR_PIXEL_FLOAT: {
                            uint16_t* dst = (uint16_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                uint16_t cval =
                                    float_to_half (*((const float*) cdata));
                                unaligned_store16 (dst, cval);
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        case EXR_PIXEL_UINT: {
                            uint16_t* dst = (uint16_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                uint16_t cval =
                                    uint_to_half (*((const uint32_t*) cdata));
                                unaligned_store16 (dst, cval);
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        default: return EXR_ERR_INVALID_ARGUMENT;
                    }
                    break;
                case EXR_PIXEL_FLOAT:
                    switch (encc->user_data_type)
                    {
                        case EXR_PIXEL_HALF: {
                            uint32_t* dst = (uint32_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                uint32_t fint = half_to_float_int (
                                    *((const uint16_t*) cdata));
                                unaligned_store32 (dst, fint);
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        case EXR_PIXEL_FLOAT: {
                            uint32_t* dst = (uint32_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                unaligned_store32 (
                                    dst, *((const uint32_t*) cdata));
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        case EXR_PIXEL_UINT: {
                            uint32_t* dst = (uint32_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                uint32_t fint = uint_to_float_int (
                                    *((const uint32_t*) cdata));
                                unaligned_store32 (dst, fint);
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        default: return EXR_ERR_INVALID_ARGUMENT;
                    }
                    break;
                case EXR_PIXEL_UINT:
                    switch (encc->user_data_type)
                    {
                        case EXR_PIXEL_HALF: {
                            uint32_t* dst = (uint32_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                uint16_t tmp = *((const uint16_t*) cdata);
                                unaligned_store32 (dst, half_to_uint (tmp));
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        case EXR_PIXEL_FLOAT: {
                            uint32_t* dst = (uint32_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                float tmp = *((const float*) cdata);
                                unaligned_store32 (dst, float_to_uint (tmp));
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        case EXR_PIXEL_UINT: {
                            uint32_t* dst = (uint32_t*) dstbuffer;
                            for (int x = 0; x < w; ++x)
                            {
                                unaligned_store32 (
                                    dst, *((const uint32_t*) cdata));
                                ++dst;
                                cdata += pixincrement;
                            }
                            break;
                        }
                        default: return EXR_ERR_INVALID_ARGUMENT;
                    }
                    break;
                default: return EXR_ERR_INVALID_ARGUMENT;
            }
            dstbuffer += chan_bytes;
            packed_bytes += chan_bytes;
        }
    }

    encode->packed_bytes = packed_bytes;

    return EXR_ERR_SUCCESS;
}